

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.c
# Opt level: O0

X509_CRL_METHOD *
X509_CRL_METHOD_new(_func_int_X509_CRL_ptr *crl_init,_func_int_X509_CRL_ptr *crl_free,
                   _func_int_X509_CRL_ptr_X509_REVOKED_ptr_ptr_ASN1_INTEGER_ptr_X509_NAME_ptr
                   *crl_lookup,_func_int_X509_CRL_ptr_EVP_PKEY_ptr *crl_verify)

{
  _func_int_X509_CRL_ptr_EVP_PKEY_ptr *in_RCX;
  _func_int_X509_CRL_ptr_X509_REVOKED_ptr_ptr_ASN1_INTEGER_ptr_X509_NAME_ptr *in_RDX;
  _func_int_X509_CRL_ptr *in_RSI;
  _func_int_X509_CRL_ptr *in_RDI;
  X509_CRL_METHOD *m;
  X509_CRL_METHOD *local_8;
  
  local_8 = (X509_CRL_METHOD *)CRYPTO_malloc(0x28,"crypto/x509/x_crl.c",0x1e5);
  if (local_8 == (X509_CRL_METHOD *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDX,(int)((ulong)in_RCX >> 0x20),(char *)local_8);
    ERR_set_error(0xb,0xc0100,(char *)0x0);
    local_8 = (X509_CRL_METHOD *)0x0;
  }
  else {
    local_8->crl_init = in_RDI;
    local_8->crl_free = in_RSI;
    local_8->crl_lookup = in_RDX;
    local_8->crl_verify = in_RCX;
    local_8->flags = 1;
  }
  return local_8;
}

Assistant:

X509_CRL_METHOD *X509_CRL_METHOD_new(int (*crl_init) (X509_CRL *crl),
                                     int (*crl_free) (X509_CRL *crl),
                                     int (*crl_lookup) (X509_CRL *crl,
                                                        X509_REVOKED **ret,
                                                        const ASN1_INTEGER *ser,
                                                        const X509_NAME *issuer),
                                     int (*crl_verify) (X509_CRL *crl,
                                                        EVP_PKEY *pk))
{
    X509_CRL_METHOD *m = OPENSSL_malloc(sizeof(*m));

    if (m == NULL) {
        ERR_raise(ERR_LIB_X509, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    m->crl_init = crl_init;
    m->crl_free = crl_free;
    m->crl_lookup = crl_lookup;
    m->crl_verify = crl_verify;
    m->flags = X509_CRL_METHOD_DYNAMIC;
    return m;
}